

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void lws_cache_heap_item_destroy
               (lws_cache_ttl_lru_t_heap_t *cache,lws_cache_ttl_item_heap_t *item,int parent_too)

{
  char *pcVar1;
  lws_dll2 *plVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  lws_cache_ttl_item_heap_t *__s;
  lws_dll2 *plVar8;
  lws_cache_ttl_item_heap_t *plVar9;
  lws_cache_ttl_lru_t_heap_t *plVar10;
  
  if (*(char *)((long)&item[1].list_expiry.prev + item->size) != '!') {
    plVar10 = (lws_cache_ttl_lru_t_heap_t *)(cache->cache).info.parent;
    plVar8 = (cache->items_lru).head;
    if (plVar10 == (lws_cache_ttl_lru_t_heap_t *)0x0) {
      plVar10 = cache;
    }
    if (plVar8 != (lws_dll2 *)0x0) {
      pcVar6 = (char *)((long)&item[1].list_expiry.prev + item->size);
      do {
        plVar2 = plVar8->next;
        if (*(char *)((long)&item[1].list_expiry.prev + item->size) == '!') {
          __s = (lws_cache_ttl_item_heap_t *)((long)&item[1].list_expiry.prev + item->size);
          sVar7 = strlen((char *)__s);
          pcVar1 = (char *)((long)&(__s->list_expiry).prev + 1);
          plVar9 = item + 1;
          do {
            if (__s <= plVar9) break;
            uVar4 = lws_ser_ru32be((uint8_t *)((long)&(plVar9->list_expiry).prev + 4));
            if ((sVar7 == uVar4) &&
               (iVar5 = strcmp((char *)&(plVar9->list_expiry).next,(char *)__s), iVar5 == 0)) {
              iVar5 = (*((plVar10->cache).info.ops)->tag_match)
                                (&plVar10->cache,pcVar1,pcVar6,'\x01');
              if (iVar5 != 0) {
                __assert_fail("!backing->info.ops->tag_match( backing, iname + 1, tag, 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                              ,0x7f,
                              "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                             );
              }
              _lws_cache_heap_item_destroy(cache,(lws_cache_ttl_item_heap_t *)(plVar8 + -1));
              bVar3 = false;
            }
            else {
              plVar9 = (lws_cache_ttl_item_heap_t *)
                       ((long)&(plVar9->list_expiry).prev + (ulong)(uVar4 + 9));
              bVar3 = true;
            }
          } while (bVar3);
          iVar5 = (*((plVar10->cache).info.ops)->tag_match)(&plVar10->cache,pcVar1,pcVar6,'\x01');
          if (iVar5 == 0) {
            __assert_fail("backing->info.ops->tag_match(backing, iname + 1, tag, 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                          ,0x8e,
                          "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                         );
          }
        }
        plVar8 = plVar2;
      } while (plVar2 != (lws_dll2 *)0x0);
    }
  }
  _lws_cache_heap_item_destroy(cache,item);
  return;
}

Assistant:

static void
_lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *cache,
			     lws_cache_ttl_item_heap_t *item)
{
	lwsl_cache("%s: %s (%s)\n", __func__, cache->cache.info.name,
			(const char *)&item[1] + item->size);

	lws_dll2_remove(&item->list_expiry);
	lws_dll2_remove(&item->list_lru);

	cache->cache.current_footprint -= item->size;

	update_sul(cache);

	if (cache->cache.info.cb)
		cache->cache.info.cb((void *)((uint8_t *)&item[1]), item->size);

	lws_free(item);
}